

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::ObjectInstance(ParsedScene *this,string *name,FileLoc loc)

{
  Float startTime;
  FileLoc loc_00;
  FileLoc loc_01;
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  Transform *renderFromInstance;
  string ret;
  Transform worldFromRender;
  AnimatedTransform animatedRenderFromInstance;
  InstanceSceneEntity local_848;
  Transform local_4e8;
  Transform local_468;
  Transform local_3e8;
  Transform local_368;
  AnimatedTransform local_2e8;
  
  if (this->currentApiState == OptionsBlock) {
    local_848.super_SceneEntity.name._M_dataplus._M_p =
         (pointer)&local_848.super_SceneEntity.name.field_2;
    local_848.super_SceneEntity.name._M_string_length = 0;
    local_848.super_SceneEntity.name.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[15]>
              ((string *)&local_848,
               "Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [15])"ObjectInstance");
    Error(&loc,local_848.super_SceneEntity.name._M_dataplus._M_p);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      if (this->currentInstance != (InstanceDefinitionSceneEntity *)0x0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"ObjectInstance can\'t be called inside instance definition");
        return;
      }
      local_4e8.m.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[0];
      local_4e8.m.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[0] + 2);
      local_4e8.m.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[1];
      local_4e8.m.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[1] + 2);
      local_4e8.m.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[2];
      local_4e8.m.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[2] + 2);
      local_4e8.m.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[3];
      local_4e8.m.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[3] + 2);
      local_4e8.mInv.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[0];
      local_4e8.mInv.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[0] + 2);
      local_4e8.mInv.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[1];
      local_4e8.mInv.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[1] + 2);
      local_4e8.mInv.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[2];
      local_4e8.mInv.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[2] + 2);
      local_4e8.mInv.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[3];
      local_4e8.mInv.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[3] + 2);
      bVar5 = pbrt::Transform::operator!=((this->curTransform).t,(this->curTransform).t + 1);
      if (bVar5) {
        GetCTM(&local_368,this,0);
        pbrt::Transform::operator*((Transform *)&local_848,&local_368,&local_4e8);
        startTime = this->transformStartTime;
        GetCTM(&local_468,this,1);
        pbrt::Transform::operator*(&local_3e8,&local_468,&local_4e8);
        AnimatedTransform::AnimatedTransform
                  (&local_2e8,(Transform *)&local_848,startTime,&local_3e8,this->transformEndTime);
        loc_00.filename._M_str = loc.filename._M_str;
        loc_00.filename._M_len = loc.filename._M_len;
        loc_00.line = loc.line;
        loc_00.column = loc.column;
        InstanceSceneEntity::InstanceSceneEntity(&local_848,name,loc_00,&local_2e8,(Transform *)0x0)
        ;
        std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
        emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_848);
        local_848.super_SceneEntity.parameters.params.nStored = 0;
        (*(local_848.super_SceneEntity.parameters.params.alloc.memoryResource)->
          _vptr_memory_resource[3])
                  (local_848.super_SceneEntity.parameters.params.alloc.memoryResource,
                   local_848.super_SceneEntity.parameters.params.ptr,
                   local_848.super_SceneEntity.parameters.params.nAlloc << 3,8);
      }
      else {
        GetCTM(&local_2e8.startTransform,this,0);
        pbrt::Transform::operator*((Transform *)&local_848,&local_2e8.startTransform,&local_4e8);
        renderFromInstance = TransformCache::Lookup(&this->transformCache,(Transform *)&local_848);
        uVar3 = loc._16_8_;
        pcVar2 = loc.filename._M_str;
        sVar1 = loc.filename._M_len;
        memset(&local_2e8,0,0x2b8);
        AnimatedTransform::AnimatedTransform(&local_2e8);
        uVar4 = loc._16_8_;
        loc_01.filename._M_str = pcVar2;
        loc_01.filename._M_len = sVar1;
        loc.line = (int)uVar3;
        loc.column = SUB84(uVar3,4);
        loc_01.line = loc.line;
        loc_01.column = loc.column;
        loc._16_8_ = uVar4;
        InstanceSceneEntity::InstanceSceneEntity
                  (&local_848,name,loc_01,&local_2e8,renderFromInstance);
        std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
        emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_848);
        local_848.super_SceneEntity.parameters.params.nStored = 0;
        (*(local_848.super_SceneEntity.parameters.params.alloc.memoryResource)->
          _vptr_memory_resource[3])
                  (local_848.super_SceneEntity.parameters.params.alloc.memoryResource,
                   local_848.super_SceneEntity.parameters.params.ptr,
                   local_848.super_SceneEntity.parameters.params.nAlloc << 3,8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_848.super_SceneEntity.name._M_dataplus._M_p ==
          &local_848.super_SceneEntity.name.field_2) {
        return;
      }
      goto LAB_00205162;
    }
    local_848.super_SceneEntity.name._M_dataplus._M_p =
         (pointer)&local_848.super_SceneEntity.name.field_2;
    local_848.super_SceneEntity.name._M_string_length = 0;
    local_848.super_SceneEntity.name.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[15]>
              ((string *)&local_848,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [15])"ObjectInstance");
    Error(&loc,local_848.super_SceneEntity.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848.super_SceneEntity.name._M_dataplus._M_p ==
      &local_848.super_SceneEntity.name.field_2) {
    return;
  }
LAB_00205162:
  operator_delete(local_848.super_SceneEntity.name._M_dataplus._M_p,
                  CONCAT71(local_848.super_SceneEntity.name.field_2._M_allocated_capacity._1_7_,
                           local_848.super_SceneEntity.name.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void ParsedScene::ObjectInstance(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectInstance");

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc,
                          "ObjectInstance can't be called inside instance definition");
        return;
    }

    class Transform worldFromRender = Inverse(renderFromWorld);

    if (CTMIsAnimated()) {
        AnimatedTransform animatedRenderFromInstance(
            GetCTM(0) * worldFromRender, transformStartTime, GetCTM(1) * worldFromRender,
            transformEndTime);

        instances.push_back(
            InstanceSceneEntity(name, loc, animatedRenderFromInstance, nullptr));
    } else {
        const class Transform *renderFromInstance =
            transformCache.Lookup(GetCTM(0) * worldFromRender);

        instances.push_back(
            InstanceSceneEntity(name, loc, AnimatedTransform(), renderFromInstance));
    }
}